

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

SSTableDataEntry * __thiscall
DiskTableNode::getEntry(SSTableDataEntry *__return_storage_ptr__,DiskTableNode *this,longlong key)

{
  bool bVar1;
  pointer ppVar2;
  unsigned_long offset;
  _Self local_30;
  iterator p;
  IndexMap *i;
  longlong key_local;
  DiskTableNode *this_local;
  
  i = (IndexMap *)key;
  key_local = (longlong)this;
  this_local = (DiskTableNode *)__return_storage_ptr__;
  p._M_node = (_Base_ptr)getIndex(this);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
       ::find((map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
               *)p._M_node,(key_type *)&i);
  offset = (unsigned_long)
           std::
           map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
           ::end((map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
                  *)p._M_node);
  bVar1 = std::operator==(&local_30,(_Self *)&offset);
  if (bVar1) {
    SSTableDataEntry::SSTableDataEntry(__return_storage_ptr__,false,0,0,"");
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_long_long,_unsigned_long>_>::operator->
                       (&local_30);
    SSTable::getEntry(__return_storage_ptr__,this->_sstable,ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

SSTableDataEntry DiskTableNode::getEntry(long long key) {
    auto *i = getIndex();
    auto p = i->find(key);
    if (p == i->end()) {
        return SSTableDataEntry{false, 0, 0, ""};
    }
    auto offset = p->second;
    return _sstable->getEntry(offset);
}